

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

int get_ext_key_name(char *namebuf,int c,int extc)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  if (c - 1U < 0x1b) {
    uVar1 = c - 8;
    iVar2 = (&switchD_00125a76::switchdataD_0013a62c)[uVar1] + 0x13a62c;
    switch(uVar1) {
    case 0:
      builtin_strncpy(namebuf,"[bksp]",7);
      return iVar2;
    case 1:
      namebuf[2] = '\0';
      namebuf[0] = '\\';
      namebuf[1] = 't';
      return iVar2;
    case 2:
    case 5:
      namebuf[2] = '\0';
      namebuf[0] = '\\';
      namebuf[1] = 'n';
      return iVar2;
    case 3:
    case 4:
      goto switchD_00125a76_caseD_3;
    default:
      if (c == 0x1b) {
        builtin_strncpy(namebuf,"[esc]",6);
        return uVar1;
      }
switchD_00125a76_caseD_3:
      namebuf[0] = '[';
      namebuf[1] = 'c';
      namebuf[2] = 't';
      namebuf[3] = 'r';
      namebuf[4] = 'l';
      namebuf[5] = '-';
      namebuf[6] = 'X';
      namebuf[7] = ']';
      namebuf[8] = '\0';
      namebuf[6] = (byte)c | 0x60;
      return 0x7274635b;
    }
  }
  if (c != 0) {
    *namebuf = (byte)c;
    namebuf[1] = '\0';
    return c - 1U;
  }
  if (0x20 < extc - 1U) {
    if (0x19 < extc - 0x80U) {
      builtin_strncpy(namebuf,"[?]",4);
      return extc - 0x80U;
    }
    namebuf[0] = '[';
    namebuf[1] = 'a';
    namebuf[2] = 'l';
    namebuf[3] = 't';
    namebuf[4] = '-';
    namebuf[5] = 'X';
    namebuf[6] = ']';
    namebuf[7] = '\0';
    namebuf[5] = (char)extc + -0x1f;
    return 0x746c615b;
  }
  pcVar3 = strcpy(namebuf,ext_key_names_rel + *(int *)(ext_key_names_rel + (ulong)(extc - 1U) * 4));
  return (int)pcVar3;
}

Assistant:

static int get_ext_key_name(char *namebuf, int c, int extc)
{
    /* if it's a control character, translate it */
    if (c >= 1 && c <= 27)
    {
        switch(c)
        {
        case 10:
        case 13:
            /* return '\n' for LF and CR characters */
            strcpy(namebuf, "\\n");
            return TRUE;

        case 9:
            /* return '\t' for TAB characters */
            strcpy(namebuf, "\\t");
            return TRUE;

        case 8:
            /* return '[bksp]' for backspace characters */
            strcpy(namebuf, "[bksp]");
            return TRUE;

        case 27:
            /* return '[esc]' for the escape key */
            strcpy(namebuf, "[esc]");
            return TRUE;

        default:
            /* return '[ctrl-X]' for other control characters */
            strcpy(namebuf, "[ctrl-X]");
            namebuf[6] = (char)(c + 'a' - 1);
            return TRUE;
        }
    }

    /* if it's any other non-extended key, return it as-is */
    if (c != 0)
    {
        namebuf[0] = c;
        namebuf[1] = '\0';
        return TRUE;
    }
    
    /* if it's in the key name array, use the array entry */
    if (extc >= 1
        && extc <= (int)(sizeof(ext_key_names)/sizeof(ext_key_names[0])))
    {
        /* use the array name */
        strcpy(namebuf, ext_key_names[extc - 1]);
        return TRUE;
    }

    /* if it's in the ALT key range, generate an ALT key name */
    if (extc >= CMD_ALT && extc <= CMD_ALT + 25)
    {
        /* generate an ALT key name */
        strcpy(namebuf, "[alt-X]");
        namebuf[5] = (char)(extc - CMD_ALT + 'a');
        return TRUE;
    }

    /* it's not a valid key - use '[?]' as the name */
    strcpy(namebuf, "[?]");
    return FALSE;
}